

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if2.c
# Opt level: O0

int i2c_read_block_data(int pi,uint handle,uint reg,char *buf)

{
  int iVar1;
  undefined8 in_RCX;
  int bytes;
  int in_stack_00000fe0;
  int in_stack_00000fe4;
  void *in_stack_00000fe8;
  int in_stack_00000ff4;
  int in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  int in_stack_fffffffffffffff0;
  
  iVar1 = pigpio_command(in_stack_fffffffffffffff0,(int)((ulong)in_RCX >> 0x20),(int)in_RCX,
                         in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0);
  if (0 < iVar1) {
    iVar1 = recvMax(in_stack_00000ff4,in_stack_00000fe8,in_stack_00000fe4,in_stack_00000fe0);
  }
  _pmu(0);
  return iVar1;
}

Assistant:

int i2c_read_block_data(int pi, unsigned handle, unsigned reg, char *buf)
{
   int bytes;

   bytes = pigpio_command(pi, PI_CMD_I2CRK, handle, reg, 0);

   if (bytes > 0)
   {
      bytes = recvMax(pi, buf, 32, bytes);
   }

   _pmu(pi);

   return bytes;
}